

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternClipboard.cpp
# Opt level: O0

void __thiscall PatternClipboard::PatternClipboard(PatternClipboard *this,QObject *parent)

{
  Object local_38 [24];
  offset_in_QClipboard_to_subr local_20;
  QClipboard *clipboard;
  QObject *parent_local;
  PatternClipboard *this_local;
  
  clipboard = (QClipboard *)parent;
  parent_local = &this->super_QObject;
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_002d34c8;
  std::optional<PatternClip>::optional(&this->mClip);
  this->mSettingClipboard = false;
  local_20 = QGuiApplication::clipboard();
  QObject::connect<void(QClipboard::*)(),void(PatternClipboard::*)()>
            (local_38,local_20,(Object *)QClipboard::dataChanged,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  parseClipboard(this);
  return;
}

Assistant:

PatternClipboard::PatternClipboard(QObject *parent) :
    QObject(parent),
    mClip(),
    mSettingClipboard(false)
{
    auto clipboard = QGuiApplication::clipboard();
    connect(clipboard, &QClipboard::dataChanged, this, &PatternClipboard::parseClipboard);
    parseClipboard();
}